

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# charmap.cpp
# Opt level: O3

size_t __thiscall
CCharmapToLocal::map_utf8_alo(CCharmapToLocal *this,char **buf,char *src,size_t srclen)

{
  int iVar1;
  undefined4 extraout_var;
  char *pcVar2;
  undefined4 extraout_var_00;
  utf8_ptr src_ptr;
  
  iVar1 = (*(this->super_CCharmap)._vptr_CCharmap[3])(this,0,0,src,srclen,0);
  pcVar2 = (char *)malloc(CONCAT44(extraout_var,iVar1) + 1);
  *buf = pcVar2;
  iVar1 = (*(this->super_CCharmap)._vptr_CCharmap[3])
                    (this,pcVar2,CONCAT44(extraout_var,iVar1),src,srclen,0);
  (*buf)[CONCAT44(extraout_var_00,iVar1)] = '\0';
  return CONCAT44(extraout_var_00,iVar1);
}

Assistant:

size_t CCharmapToLocal::map_utf8_alo(
    char **buf, const char *src, size_t srclen) const
{
    /* figure out how much space we need */
    size_t buflen = map_utf8(0, 0, src, srclen, 0);

    /* allocate the buffer, adding space for null termination */
    *buf = (char *)t3malloc(buflen + 1);
    
    /* if that failed, return null */
    if (buf == 0)
        return 0;

    /* do the mapping */
    buflen = map_utf8(*buf, buflen, src, srclen, 0);

    /* fill in the null terminator */
    (*buf)[buflen] = '\0';

    /* return the mapped length */
    return buflen;
}